

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_IsValidKnotVector(int order,int cv_count,double *knot,ON_TextLog *text_logx)

{
  bool bVar1;
  ON_TextLog *this;
  int iVar2;
  bool bVar3;
  uint local_5c;
  double *pdStack_58;
  int i;
  double *k1;
  double *k0;
  ON_TextLog *text_log;
  bool bSilentError;
  ON__INT_PTR hightbits;
  ON__INT_PTR lowbit;
  ON_TextLog *text_logx_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  bVar3 = ((ulong)text_logx & 1) != 0;
  this = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  if (order < 2) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector order = %d (should be >= 2 )\n",(ulong)(uint)order);
    }
    cv_count_local._3_1_ = ON_KnotVectorIsNotValid(bVar3);
  }
  else if (cv_count < order) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector cv_count = %d (should be >= order=%d )\n",
                        (ulong)(uint)cv_count,(ulong)(uint)order);
    }
    cv_count_local._3_1_ = ON_KnotVectorIsNotValid(bVar3);
  }
  else if (knot == (double *)0x0) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector knot array = nullptr.\n");
    }
    cv_count_local._3_1_ = ON_KnotVectorIsNotValid(bVar3);
  }
  else {
    for (local_5c = 0; (int)local_5c < cv_count + order + -2; local_5c = local_5c + 1) {
      bVar1 = ON_IsValid(knot[(int)local_5c]);
      if (!bVar1) {
        if (this != (ON_TextLog *)0x0) {
          ON_TextLog::Print(this,"Knot vector knot[%d]=%g is not valid.\n",knot[(int)local_5c],
                            (ulong)local_5c);
        }
        bVar3 = ON_KnotVectorIsNotValid(bVar3);
        return bVar3;
      }
    }
    if (knot[order + -2] < knot[order + -1]) {
      if (knot[cv_count + -2] < knot[cv_count + -1]) {
        pdStack_58 = knot + 1;
        local_5c = order + cv_count + -3;
        k1 = knot;
        while (iVar2 = local_5c + -1, local_5c != 0) {
          if (*pdStack_58 < *k1) {
            if (this != (ON_TextLog *)0x0) {
              ON_TextLog::Print(this,
                                "Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",*k1
                                ,*pdStack_58,(ulong)(uint)((order + cv_count + -4) - iVar2),
                                (ulong)(uint)((order + cv_count + -3) - iVar2));
            }
            bVar3 = ON_KnotVectorIsNotValid(bVar3);
            return bVar3;
          }
          k1 = k1 + 1;
          pdStack_58 = pdStack_58 + 1;
          local_5c = iVar2;
        }
        pdStack_58 = knot + (long)order + -1;
        local_5c = cv_count + -1;
        k1 = knot;
        while (iVar2 = local_5c + -1, local_5c != 0) {
          if (*pdStack_58 < *k1 || *pdStack_58 == *k1) {
            if (this != (ON_TextLog *)0x0) {
              ON_TextLog::Print(this,"Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n",*k1,
                                *pdStack_58,(ulong)(uint)order,
                                (ulong)(uint)((cv_count + -2) - iVar2),
                                (ulong)(uint)((cv_count + -1) - iVar2));
            }
            bVar3 = ON_KnotVectorIsNotValid(bVar3);
            return bVar3;
          }
          k1 = k1 + 1;
          pdStack_58 = pdStack_58 + 1;
          local_5c = iVar2;
        }
        cv_count_local._3_1_ = true;
      }
      else {
        if (this != (ON_TextLog *)0x0) {
          ON_TextLog::Print(this,
                            "Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n"
                            ,knot[cv_count + -2],knot[cv_count + -1],(ulong)(uint)cv_count,
                            (ulong)(cv_count - 2),(ulong)(cv_count - 1));
        }
        cv_count_local._3_1_ = ON_KnotVectorIsNotValid(bVar3);
      }
    }
    else {
      if (this != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this,
                          "Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n"
                          ,knot[order + -2],knot[order + -1],(ulong)(uint)order,(ulong)(order - 2),
                          (ulong)(order - 1));
      }
      cv_count_local._3_1_ = ON_KnotVectorIsNotValid(bVar3);
    }
  }
  return cv_count_local._3_1_;
}

Assistant:

bool ON_IsValidKnotVector( int order, int cv_count, const double* knot, ON_TextLog* text_logx )
{
  // If low bit of text_log pointer is 1, then ON_Error is not called when the
  // knot vector is invalid.
  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  const double *k0, *k1;
  int i;
  if ( order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order = %d (should be >= 2 )\n",order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( cv_count < order )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count = %d (should be >= order=%d )\n",cv_count,order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( knot == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector knot array = nullptr.\n");
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  for ( i = 0; i < cv_count+order-2; i++ )
  {
    if ( !ON_IsValid(knot[i]) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector knot[%d]=%g is not valid.\n",i,knot[i]);
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
  }

  if ( !(knot[order-2] < knot[order-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n",
                       order,order-2,knot[order-2],order-1,knot[order-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( !(knot[cv_count-2] < knot[cv_count-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n",
                       cv_count,cv_count-2,knot[cv_count-2],cv_count-1,knot[cv_count-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  // entire array must be monotone increasing
  k0 = knot;
  k1 = knot+1;
  i = order + cv_count - 3;
  while (i--) {
    if ( !(*k1 >= *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                         order+cv_count-4-i, *k0, order+cv_count-3-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  // must have knot[i+order-1] > knot[i]
  k0 = knot;
  k1 = knot + order - 1;
  i = cv_count-1;
  while(i--) {
    if ( !(*k1 > *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n",
                         order, cv_count-2-i, *k0, cv_count-1-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  return true;
}